

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

stbfile * stb_open_outbuffer(uchar **update_on_close)

{
  stbfile *__dest;
  stbfile *z;
  stbfile m;
  uchar **update_on_close_local;
  
  m.field_12 = (anon_union_8_2_1b07d41e_for_stbfile_12)update_on_close;
  memcpy(&z,&PTR_stb__nogetbyte_0025acf0,0x68);
  __dest = (stbfile *)malloc(0x68);
  if (__dest != (stbfile *)0x0) {
    __dest->field_12 = m.field_12;
    memcpy(__dest,&z,0x68);
  }
  return __dest;
}

Assistant:

stbfile *stb_open_outbuffer(unsigned char **update_on_close)
{
   stbfile m = { stb__nogetbyte, stb__nogetdata,
                 stb__aputbyte, stb__aputdata,
                 stb__asize, stb__asize, stb__abackpatch, stb__aclose };
   stbfile *z = (stbfile *) malloc(sizeof(*z));
   if (z) {
      z->ptr = update_on_close;
      *z = m;
   }
   return z;
}